

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O0

shared_ptr<KmerList>
BatchKmersCounter::buildKMerCount
          (uint8_t K,LongReadsDatastore *reads,uint minCount,string *workdir,string *tmpdir,
          uchar disk_batches)

{
  KMerNodeFreq_s *pKVar1;
  byte K_00;
  bool bVar2;
  ostream *poVar3;
  size_t gto;
  element_type *peVar4;
  void *pvVar5;
  uint in_ECX;
  LongReadsDatastore *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  byte in_SIL;
  uint uVar7;
  element_type *in_RDI;
  string *in_R8;
  string *in_R9;
  shared_ptr<KmerList> sVar8;
  byte in_stack_00000008;
  int i;
  ofstream kff;
  KMerNodeFreq_s *itr;
  KMerNodeFreq_s *send;
  KMerNodeFreq_s *witr;
  uint64_t used;
  uint64_t hist [256];
  shared_ptr<KmerList> *spectrum;
  undefined4 in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff44c;
  undefined7 in_stack_fffffffffffff450;
  undefined1 in_stack_fffffffffffff457;
  char *in_stack_fffffffffffff470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff478;
  string local_af0;
  string local_ad0;
  BatchKmersCounter local_ab0 [20];
  int local_a9c;
  string local_a98 [32];
  undefined1 local_a78 [512];
  KMerNodeFreq_s *local_878;
  KMerNodeFreq_s *local_870;
  KMerNodeFreq_s *local_868;
  BatchKmersCounter local_860 [16];
  ulong local_850;
  ulong local_848 [258];
  undefined1 local_31;
  uint local_1c;
  LongReadsDatastore *local_18;
  byte local_9;
  
  local_31 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_9 = in_SIL;
  std::make_shared<KmerList>();
  poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
  poVar3 = std::operator<<(poVar3,"creating kmers from reads...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (in_stack_00000008 < 2) {
    memset(local_848,0,0x800);
    K_00 = local_9;
    local_850 = 0;
    gto = LongReadsDatastore::size((LongReadsDatastore *)0x48aa12);
    kmerCountOMP(local_860,K_00,local_18,0,gto,0);
    std::shared_ptr<KmerList>::operator=
              ((shared_ptr<KmerList> *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450)
               ,(shared_ptr<KmerList> *)
                CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    std::shared_ptr<KmerList>::~shared_ptr((shared_ptr<KmerList> *)0x48aa6f);
    peVar4 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x48aa7c);
    local_868 = peVar4->kmers;
    peVar4 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x48aa94);
    pKVar1 = peVar4->kmers;
    peVar4 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x48aaa9);
    local_870 = pKVar1 + peVar4->size;
    peVar4 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x48aace);
    for (local_878 = peVar4->kmers; local_878 != local_870; local_878 = local_878 + 1) {
      local_848[local_878->count] = local_848[local_878->count] + 1;
      if (local_1c <= local_878->count) {
        *(long *)&local_868->kdata = (long)local_878->kdata;
        *(undefined8 *)((long)&local_868->kdata + 8) = *(undefined8 *)((long)&local_878->kdata + 8);
        local_868->count = local_878->count;
        local_868 = local_868 + 1;
        local_850 = local_850 + 1;
      }
    }
    poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff478 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff478 >> 0x18,0));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_850);
    poVar3 = std::operator<<(poVar3,"/");
    peVar4 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x48abf7);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,peVar4->size);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_9);
    poVar3 = std::operator<<(poVar3,"-mers with Freq >= ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,local_1c);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x48ac8d);
    KmerList::resize((KmerList *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                     CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    std::operator+(in_stack_fffffffffffff478,in_stack_fffffffffffff470);
    std::ofstream::ofstream(local_a78,local_a98,_S_out);
    std::__cxx11::string::~string(local_a98);
    for (local_a9c = 1; local_a9c < 0x100; local_a9c = local_a9c + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(local_a78,local_a9c);
      poVar3 = std::operator<<(poVar3,", ");
      pvVar5 = (void *)std::ostream::operator<<(poVar3,local_848[local_a9c]);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_a78);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    bVar2 = std::operator==((char *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
    if (bVar2) {
      std::__cxx11::string::operator=(in_R9,in_R8);
    }
    std::__cxx11::string::string((string *)&local_ad0,in_R9);
    std::__cxx11::string::string((string *)&local_af0,in_R8);
    uVar7 = (uint)in_stack_00000008;
    kmerCountOMPDiskBased
              (local_ab0,local_9,local_18,local_1c,&local_ad0,&local_af0,in_stack_00000008);
    std::shared_ptr<KmerList>::operator=
              ((shared_ptr<KmerList> *)CONCAT17(local_9,in_stack_fffffffffffff450),
               (shared_ptr<KmerList> *)CONCAT44(in_stack_fffffffffffff44c,uVar7));
    std::shared_ptr<KmerList>::~shared_ptr((shared_ptr<KmerList> *)0x48aeda);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::~string((string *)&local_ad0);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar8.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<KmerList>)sVar8.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::buildKMerCount(uint8_t K, LongReadsDatastore const &reads, unsigned minCount,
                                  std::string workdir, std::string tmpdir, unsigned char disk_batches) {
    std::shared_ptr<KmerList> spectrum=std::make_shared<KmerList>();
    sdglib::OutputLog() << "creating kmers from reads..." << std::endl;
    if (1 >= disk_batches) {
        uint64_t hist[256]={0};
        uint64_t used=0;
        spectrum=kmerCountOMP(K, reads, 0, reads.size(), 0);
        auto witr=spectrum->kmers;
        auto send=spectrum->kmers+spectrum->size;
        for (auto itr=spectrum->kmers;itr!=send;++itr){
            ++hist[itr->count];
            if (itr->count>=minCount) {
                (*witr)=(*itr);
                ++witr;
                ++used;
            }

        }
        sdglib::OutputLog() << used << "/" << spectrum->size << " " << int(K)<<"-mers with Freq >= " << minCount << std::endl;
        spectrum->resize(used);
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
        //todo: filter kmers to minCount
    } else {
        if ("" == tmpdir) tmpdir = workdir;
        spectrum=kmerCountOMPDiskBased(K, reads, minCount, tmpdir, workdir, disk_batches);
    }

    return spectrum;
}